

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::execute
          (FreeColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  int iVar1;
  fpclass_type fVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  int32_t iVar5;
  int32_t iVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  long lVar12;
  long lVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  uint *puVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  uint *puVar18;
  pointer pnVar19;
  fpclass_type fVar20;
  int32_t *piVar21;
  long lVar22;
  byte bVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  uint local_3d8 [3];
  undefined3 uStack_3cb;
  int iStack_3c8;
  bool bStack_3c4;
  undefined8 local_3c0;
  fpclass_type local_3b8;
  int32_t iStack_3b4;
  undefined8 uStack_3b0;
  cpp_dec_float<200U,_int,_void> local_3a8;
  cpp_dec_float<200U,_int,_void> local_328;
  cpp_dec_float<200U,_int,_void> local_2a8;
  cpp_dec_float<200U,_int,_void> local_228;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [13];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  
  bVar23 = 0;
  iVar10 = this->m_i;
  iVar1 = this->m_old_i;
  if (iVar10 != iVar1) {
    pnVar3 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar15 = (uint *)(pnVar3 + iVar10);
    puVar18 = (uint *)(pnVar3 + iVar1);
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar15;
      puVar15 = puVar15 + 1;
      puVar18 = puVar18 + 1;
    }
    pnVar3[iVar1].m_backend.exp = pnVar3[iVar10].m_backend.exp;
    pnVar3[iVar1].m_backend.neg = pnVar3[iVar10].m_backend.neg;
    iVar6 = pnVar3[iVar10].m_backend.prec_elem;
    pnVar3[iVar1].m_backend.fpclass = pnVar3[iVar10].m_backend.fpclass;
    pnVar3[iVar1].m_backend.prec_elem = iVar6;
    iVar10 = this->m_i;
    pnVar3 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = this->m_old_i;
    puVar15 = (uint *)(pnVar3 + iVar10);
    puVar18 = (uint *)(pnVar3 + iVar1);
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar15;
      puVar15 = puVar15 + 1;
      puVar18 = puVar18 + 1;
    }
    pnVar3[iVar1].m_backend.exp = pnVar3[iVar10].m_backend.exp;
    pnVar3[iVar1].m_backend.neg = pnVar3[iVar10].m_backend.neg;
    iVar6 = pnVar3[iVar10].m_backend.prec_elem;
    pnVar3[iVar1].m_backend.fpclass = pnVar3[iVar10].m_backend.fpclass;
    pnVar3[iVar1].m_backend.prec_elem = iVar6;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  iVar10 = this->m_j;
  iVar1 = this->m_old_j;
  if (iVar10 != iVar1) {
    pnVar3 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar15 = (uint *)(pnVar3 + iVar10);
    puVar18 = (uint *)(pnVar3 + iVar1);
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar15;
      puVar15 = puVar15 + 1;
      puVar18 = puVar18 + 1;
    }
    pnVar3[iVar1].m_backend.exp = pnVar3[iVar10].m_backend.exp;
    pnVar3[iVar1].m_backend.neg = pnVar3[iVar10].m_backend.neg;
    iVar6 = pnVar3[iVar10].m_backend.prec_elem;
    pnVar3[iVar1].m_backend.fpclass = pnVar3[iVar10].m_backend.fpclass;
    pnVar3[iVar1].m_backend.prec_elem = iVar6;
    iVar10 = this->m_j;
    pnVar3 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = this->m_old_j;
    puVar15 = (uint *)(pnVar3 + iVar10);
    puVar18 = (uint *)(pnVar3 + iVar1);
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar18 = *puVar15;
      puVar15 = puVar15 + 1;
      puVar18 = puVar18 + 1;
    }
    pnVar3[iVar1].m_backend.exp = pnVar3[iVar10].m_backend.exp;
    pnVar3[iVar1].m_backend.neg = pnVar3[iVar10].m_backend.neg;
    iVar6 = pnVar3[iVar10].m_backend.prec_elem;
    pnVar3[iVar1].m_backend.fpclass = pnVar3[iVar10].m_backend.fpclass;
    pnVar3[iVar1].m_backend.prec_elem = iVar6;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_328.fpclass = cpp_dec_float_finite;
  local_328.prec_elem = 0x1c;
  local_328.data._M_elems[0] = 0;
  local_328.data._M_elems[1] = 0;
  local_328.data._M_elems[2] = 0;
  local_328.data._M_elems[3] = 0;
  local_328.data._M_elems[4] = 0;
  local_328.data._M_elems[5] = 0;
  local_328.data._M_elems[6] = 0;
  local_328.data._M_elems[7] = 0;
  local_328.data._M_elems[8] = 0;
  local_328.data._M_elems[9] = 0;
  local_328.data._M_elems[10] = 0;
  local_328.data._M_elems[0xb] = 0;
  local_328.data._M_elems[0xc] = 0;
  local_328.data._M_elems[0xd] = 0;
  local_328.data._M_elems[0xe] = 0;
  local_328.data._M_elems[0xf] = 0;
  local_328.data._M_elems[0x10] = 0;
  local_328.data._M_elems[0x11] = 0;
  local_328.data._M_elems[0x12] = 0;
  local_328.data._M_elems[0x13] = 0;
  local_328.data._M_elems[0x14] = 0;
  local_328.data._M_elems[0x15] = 0;
  local_328.data._M_elems[0x16] = 0;
  local_328.data._M_elems[0x17] = 0;
  local_328.data._M_elems[0x18] = 0;
  local_328.data._M_elems[0x19] = 0;
  local_328.data._M_elems._104_5_ = 0;
  local_328.data._M_elems[0x1b]._1_3_ = 0;
  local_328.exp = 0;
  local_328.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_328,0.0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_120,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  iVar10 = (this->m_row).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar10) {
    lVar12 = 0;
    lVar22 = 0;
    do {
      pNVar4 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar1 = *(int *)((long)(&pNVar4->val + 1) + lVar12);
      if (iVar1 != this->m_j) {
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(pNVar4->val).m_backend.data._M_elems + lVar12);
        pcVar17 = &(x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend;
        local_3c0._0_4_ = cpp_dec_float_finite;
        local_3c0._4_4_ = 0x1c;
        local_438 = ZEXT816(0);
        local_428 = ZEXT816(0);
        local_418 = ZEXT816(0);
        local_408 = ZEXT816(0);
        local_3f8 = ZEXT816(0);
        local_3e8 = ZEXT816(0);
        local_3d8[0] = 0;
        local_3d8[1] = 0;
        stack0xfffffffffffffc30 = 0;
        uStack_3cb = 0;
        iStack_3c8 = 0;
        bStack_3c4 = false;
        pcVar11 = pcVar16;
        if (((cpp_dec_float<200U,_int,_void> *)local_438 != pcVar17) &&
           (pcVar11 = pcVar17, pcVar16 != (cpp_dec_float<200U,_int,_void> *)local_438)) {
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_438;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4);
          }
          iStack_3c8 = *(int *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar12);
          bStack_3c4 = *(bool *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar12 + 4);
          local_3c0 = *(undefined8 *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar12 + 8);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar11);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&local_328,(cpp_dec_float<200U,_int,_void> *)local_438);
        iVar10 = (this->m_row).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
      }
      lVar22 = lVar22 + 1;
      lVar12 = lVar12 + 0x84;
    } while (lVar22 < iVar10);
  }
  u = &this->m_lRhs;
  pnVar14 = u;
  puVar15 = (uint *)local_438;
  for (lVar12 = 0x1c; uVar8 = local_328._120_8_, bVar7 = local_328.neg, iVar10 = local_328.exp,
      lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar15 = (pnVar14->m_backend).data._M_elems[0];
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + (ulong)bVar23 * -8 + 4);
    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
  }
  bStack_3c4 = (this->m_lRhs).m_backend.neg;
  iStack_3c8 = (this->m_lRhs).m_backend.exp;
  fVar2 = (this->m_lRhs).m_backend.fpclass;
  iVar5 = (this->m_lRhs).m_backend.prec_elem;
  local_3c0._0_4_ = fVar2;
  local_3c0._4_4_ = iVar5;
  if ((bStack_3c4 == true) && (local_438._0_4_ != 0 || fVar2 != cpp_dec_float_finite)) {
    bStack_3c4 = false;
  }
  pcVar16 = &local_328;
  pcVar11 = &local_3a8;
  for (lVar12 = 0x1c; uVar9 = local_328._120_8_, lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar11->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar23 * -2 + 1) * 4);
  }
  local_3a8.exp = iVar10;
  local_3a8.neg = bVar7;
  local_328.fpclass = (fpclass_type)uVar8;
  local_328.prec_elem = SUB84(uVar8,4);
  local_3a8.fpclass = local_328.fpclass;
  local_3a8.prec_elem = local_328.prec_elem;
  fVar20 = (fpclass_type)uVar8;
  if ((bVar7 != false) && (fVar20 != cpp_dec_float_finite || local_3a8.data._M_elems[0] != 0)) {
    local_3a8.neg = (bool)(bVar7 ^ 1);
  }
  local_328._120_8_ = uVar9;
  if (fVar20 != cpp_dec_float_NaN && fVar2 != cpp_dec_float_NaN) {
    iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)local_438,&local_3a8);
    if (0 < iVar10) {
      piVar21 = (int32_t *)((long)&local_3c0 + 4);
      puVar15 = (uint *)local_438;
      pcVar16 = &local_2a8;
      for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar16->data)._M_elems[0] = *puVar15;
        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_2a8.exp = iStack_3c8;
      local_2a8.neg = bStack_3c4;
      goto LAB_0057d3bb;
    }
    fVar20 = local_3a8.fpclass;
  }
  local_3c0._0_4_ = fVar20;
  piVar21 = &local_3a8.prec_elem;
  pcVar16 = &local_3a8;
  pcVar11 = &local_2a8;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar11->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar23 * -2 + 1) * 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar23 * -2 + 1) * 4);
  }
  local_2a8.exp = local_3a8.exp;
  local_2a8.neg = local_3a8.neg;
LAB_0057d3bb:
  local_2a8.fpclass = (fpclass_type)local_3c0;
  local_2a8.prec_elem = *piVar21;
  if ((fpclass_type)local_3c0 != cpp_dec_float_NaN) {
    local_3c0._0_4_ = cpp_dec_float_finite;
    local_3c0._4_4_ = 0x1c;
    local_438 = (undefined1  [16])0x0;
    local_428 = (undefined1  [16])0x0;
    local_418 = (undefined1  [16])0x0;
    local_408 = (undefined1  [16])0x0;
    local_3f8 = (undefined1  [16])0x0;
    local_3e8 = (undefined1  [16])0x0;
    local_3d8[0] = 0;
    local_3d8[1] = 0;
    stack0xfffffffffffffc30 = 0;
    uStack_3cb = 0;
    iStack_3c8 = 0;
    bStack_3c4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_438,1.0);
    iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_2a8,(cpp_dec_float<200U,_int,_void> *)local_438);
    if (iVar10 < 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_2a8,1.0);
    }
  }
  local_3c0._0_4_ = cpp_dec_float_finite;
  local_3c0._4_4_ = 0x1c;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3d8[0] = 0;
  local_3d8[1] = 0;
  stack0xfffffffffffffc30 = 0;
  uStack_3cb = 0;
  iStack_3c8 = 0;
  bStack_3c4 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_438,&u->m_backend,&local_2a8);
  local_130._0_4_ = cpp_dec_float_finite;
  local_130._4_4_ = 0x1c;
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  local_148 = SUB1613((undefined1  [16])0x0,0);
  uStack_13b = 0;
  iStack_138 = 0;
  bStack_134 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_1a8,&local_328,&local_2a8);
  pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_438;
  pcVar11 = &local_3a8;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar11->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar23 * -8 + 4);
  }
  local_3a8.exp = iStack_3c8;
  local_3a8.neg = bStack_3c4;
  local_3a8.fpclass = (fpclass_type)local_3c0;
  local_3a8.prec_elem = local_3c0._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&local_3a8,(cpp_dec_float<200U,_int,_void> *)local_1a8);
  uVar8 = local_3a8._120_8_;
  bVar7 = local_3a8.neg;
  iVar10 = local_3a8.exp;
  pcVar16 = &local_3a8;
  puVar15 = local_a0;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar15 = (pcVar16->data)._M_elems[0];
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
  }
  local_3b8 = local_3a8.fpclass;
  iStack_3b4 = local_3a8.prec_elem;
  uStack_3b0 = 0;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_228,this);
  puVar15 = local_a0;
  puVar18 = (uint *)local_438;
  for (lVar12 = 0x1c; uVar9 = local_3a8._120_8_, lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar18 = *puVar15;
    puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
    puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
  }
  iStack_3c8 = iVar10;
  bStack_3c4 = bVar7;
  local_3a8.fpclass = (fpclass_type)uVar8;
  local_3a8.prec_elem = SUB84(uVar8,4);
  local_3c0._0_4_ = local_3a8.fpclass;
  local_3c0._4_4_ = local_3a8.prec_elem;
  if ((bVar7 == true) && (local_438._0_4_ != 0 || local_3b8 != cpp_dec_float_finite)) {
    bStack_3c4 = false;
  }
  local_3a8._120_8_ = uVar9;
  if (((local_3b8 != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN)) &&
     (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_438,&local_228), iVar10 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_3a8,0.0);
  }
  pcVar16 = &local_3a8;
  pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_1a8;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar11->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar23 * -2 + 1) * 4);
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar23 * -8 + 4);
  }
  iStack_138 = local_3a8.exp;
  bStack_134 = local_3a8.neg;
  local_130._0_4_ = local_3a8.fpclass;
  local_130._4_4_ = local_3a8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_1a8,&local_2a8);
  local_3c0._0_4_ = cpp_dec_float_finite;
  local_3c0._4_4_ = 0x1c;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3d8[0] = 0;
  local_3d8[1] = 0;
  stack0xfffffffffffffc30 = 0;
  uStack_3cb = 0;
  iStack_3c8 = 0;
  bStack_3c4 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_438,(cpp_dec_float<200U,_int,_void> *)local_1a8
             ,&local_120);
  iVar10 = this->m_j;
  pnVar3 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_438;
  pnVar19 = pnVar3 + iVar10;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar19->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
    pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
  }
  pnVar3[iVar10].m_backend.exp = iStack_3c8;
  pnVar3[iVar10].m_backend.neg = bStack_3c4;
  pnVar3[iVar10].m_backend.fpclass = (fpclass_type)local_3c0;
  pnVar3[iVar10].m_backend.prec_elem = local_3c0._4_4_;
  iVar10 = this->m_i;
  pnVar3 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar19 = pnVar3 + iVar10;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar19->m_backend).data._M_elems[0] = (u->m_backend).data._M_elems[0];
    u = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)((long)u + (ulong)bVar23 * -8 + 4);
    pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
  }
  pnVar3[iVar10].m_backend.exp = (this->m_lRhs).m_backend.exp;
  pnVar3[iVar10].m_backend.neg = (this->m_lRhs).m_backend.neg;
  iVar6 = (this->m_lRhs).m_backend.prec_elem;
  pnVar3[iVar10].m_backend.fpclass = (this->m_lRhs).m_backend.fpclass;
  pnVar3[iVar10].m_backend.prec_elem = iVar6;
  local_3c0._0_4_ = cpp_dec_float_finite;
  local_3c0._4_4_ = 0x1c;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3d8[0] = 0;
  local_3d8[1] = 0;
  stack0xfffffffffffffc30 = 0;
  uStack_3cb = 0;
  iStack_3c8 = 0;
  bStack_3c4 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_438,&(this->m_obj).m_backend,&local_120);
  iVar10 = this->m_i;
  pnVar3 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_438;
  pnVar19 = pnVar3 + iVar10;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar19->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
    pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
  }
  pnVar3[iVar10].m_backend.exp = iStack_3c8;
  pnVar3[iVar10].m_backend.neg = bStack_3c4;
  pnVar3[iVar10].m_backend.fpclass = (fpclass_type)local_3c0;
  pnVar3[iVar10].m_backend.prec_elem = local_3c0._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)
             ((r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  cStatus->data[this->m_j] = BASIC;
  if (this->m_eqCons == true) {
    rStatus->data[this->m_i] = FIXED;
  }
  else if (this->m_onLhs == true) {
    rStatus->data[this->m_i] = ON_LOWER;
  }
  else {
    rStatus->data[this->m_i] = ON_UPPER;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_lRhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_lRhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_lRhs;

   // dual:
   y[m_i] = m_obj / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}